

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

int __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorNoActiveQuery::init
          (TransformFeedbackOverflowQueryErrorNoActiveQuery *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryErrorNoActiveQuery *this_local;
  
  TransformFeedbackOverflowQueryBaseTest::init((TransformFeedbackOverflowQueryBaseTest *)this,ctx);
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryErrorBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  iVar3 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x6e0))(1,&this->m_active_stream_overflow_query);
    this->m_active_query_stream_index = 2;
    iVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x28))
                      (0x82ed,this->m_active_query_stream_index,this->m_active_stream_overflow_query
                      );
  }
  return iVar3;
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryErrorBase::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (supportsTransformFeedback3())
		{
			gl.genQueries(1, &m_active_stream_overflow_query);
			m_active_query_stream_index = 2;
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_active_query_stream_index,
								 m_active_stream_overflow_query);
		}
	}